

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_move_semantics.cpp
# Opt level: O2

void test_useless(void)

{
  Useless four;
  Useless one;
  Useless three;
  Useless two;
  
  L18_1::Useless::Useless(&one,10,'x');
  L18_1::Useless::Useless(&two,&one);
  L18_1::Useless::Useless(&three,0x14,'o');
  L18_1::Useless::operator+(&four,&one);
  std::operator<<((ostream *)&std::cout,"\nOne: \n");
}

Assistant:

void test_useless() {
    using namespace L18_1;
//    using namespace std;

    //  10 x 'x'
    Useless one(10, 'x');
    Useless two = one;  //  calls 'copy constructor'
    Useless three(20, 'o');
    //  first, '+'
    //  then, 'copy constructor?'
    //  the mingw compiler doesn't call 'move constructor', but still transfer ownership of 'temp'...
    Useless four(one + three);

    cout << "\nOne: \n";
    one.showData();
    cout << "\nTwo: \n";
    two.showData();
    cout << "\nThree: \n";
    three.showData();
    cout << "\nFour: \n";
    four.showData();

    //  use std::move
    cout << "four = move(one):\n";
    //  this will call 'copy assignment'
    four = one;
    four.showData();
    //  this will call 'move assignment'
    //  std::move make left-value(one) into right-value
    four = std::move(one);
    four.showData();
}